

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

bool fmt::v8::detail::
     write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,char8_t>
               (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *out,unsigned_long value,
               uint prefix,basic_format_specs<char8_t> *specs,locale_ref loc)

{
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar1;
  digit_grouping<char8_t> grouping;
  digit_grouping<char8_t> local_50;
  
  digit_grouping<char8_t>::digit_grouping(&local_50,loc,true);
  bVar1 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,char8_t>
                    (out->container,value,prefix,specs,&local_50);
  out->container = (buffer<char8_t> *)bVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.sep_.grouping._M_dataplus._M_p != &local_50.sep_.grouping.field_2) {
    operator_delete(local_50.sep_.grouping._M_dataplus._M_p,
                    local_50.sep_.grouping.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  auto grouping = digit_grouping<Char>(loc);
  out = write_int_localized(out, value, prefix, specs, grouping);
  return true;
}